

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O0

Material * rw::Material::streamRead(Stream *stream)

{
  RGBA *pRVar1;
  undefined4 uVar2;
  FILE *pFVar3;
  bool bVar4;
  char *pcVar5;
  Texture *pTVar6;
  Error local_50;
  Error _e_1;
  Material *mat;
  uint32 local_38;
  RGBA col;
  Error _e;
  MatStreamData buf;
  uint32 version;
  uint32 length;
  Stream *stream_local;
  
  bVar4 = findChunk(stream,1,(uint32 *)0x0,(uint32 *)&buf.unused);
  if (!bVar4) {
    local_38 = 7;
    col.red = '\x04';
    col.green = '\0';
    col.blue = '\0';
    col.alpha = 0x80;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/geometry.cpp",0x3a4);
    pFVar3 = _stderr;
    pcVar5 = dbgsprint(0x80000004,"STRUCT");
    fprintf(pFVar3,"%s\n",pcVar5);
    setError((Error *)&stack0xffffffffffffffc8);
    return (Material *)0x0;
  }
  (*stream->_vptr_Stream[4])(stream,&_e,0x10);
  memNative32(&_e,0x10);
  _e_1 = (Error)create();
  if (_e_1 == (Error)0x0) {
    return (Material *)0x0;
  }
  pRVar1 = (RGBA *)((long)_e_1 + 8);
  pRVar1->red = (undefined1)_e.code;
  pRVar1->green = _e.code._1_1_;
  pRVar1->blue = _e.code._2_1_;
  pRVar1->alpha = _e.code._3_1_;
  if ((uint)buf.unused < 0x30400) {
    uVar2 = defaultSurfaceProps._4_4_;
    ((SurfaceProperties *)((long)_e_1 + 0xc))->ambient = (float32)(undefined4)defaultSurfaceProps;
    ((SurfaceProperties *)((long)_e_1 + 0xc))->specular = (float32)uVar2;
    *(float32 *)((long)_e_1 + 0x14) = DAT_001678cc;
  }
  else {
    Stream::read32(stream,(SurfaceProperties *)((long)_e_1 + 0xc),0xc);
  }
  if (buf.color != (RGBA)0x0) {
    bVar4 = findChunk(stream,6,(uint32 *)&buf.textured,(uint32 *)0x0);
    if (!bVar4) {
      local_50.plugin = 7;
      local_50.code = 0x80000004;
      fprintf(_stderr,"%s:%d: ",
              "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/geometry.cpp",0x3b5
             );
      pFVar3 = _stderr;
      pcVar5 = dbgsprint(0x80000004,"TEXTURE");
      fprintf(pFVar3,"%s\n",pcVar5);
      setError(&local_50);
      goto LAB_0010d786;
    }
    pTVar6 = Texture::streamRead(stream);
    *(Texture **)_e_1 = pTVar6;
  }
  materialRights = 0;
  bVar4 = PluginList::streamRead((PluginList *)&s_plglist,stream,(void *)_e_1);
  if (bVar4) {
    if (materialRights != 0) {
      PluginList::assertRights((PluginList *)&s_plglist,(void *)_e_1,materialRights,DAT_001689dc);
    }
    return (Material *)_e_1;
  }
LAB_0010d786:
  destroy((Material *)_e_1);
  return (Material *)0x0;
}

Assistant:

Material*
Material::streamRead(Stream *stream)
{
	uint32 length, version;
	MatStreamData buf;

	if(!findChunk(stream, ID_STRUCT, nil, &version)){
		RWERROR((ERR_CHUNK, "STRUCT"));
		return nil;
	}
	stream->read8(&buf, sizeof(buf));
	RGBA col = buf.color;
	memNative32(&buf, sizeof(buf));
	buf.color = col;
	Material *mat = Material::create();
	if(mat == nil)
		return nil;
	mat->color = buf.color;
	if(version < 0x30400)
		mat->surfaceProps = defaultSurfaceProps;
	else
		stream->read32(&mat->surfaceProps, sizeof(SurfaceProperties));
	if(buf.textured){
		if(!findChunk(stream, ID_TEXTURE, &length, nil)){
			RWERROR((ERR_CHUNK, "TEXTURE"));
			goto fail;
		}
		mat->texture = Texture::streamRead(stream);
	}

	materialRights[0] = 0;
	if(!s_plglist.streamRead(stream, mat))
		goto fail;
	if(materialRights[0])
		s_plglist.assertRights(mat, materialRights[0], materialRights[1]);
	return mat;

fail:
	mat->destroy();
	return nil;
}